

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix33<double> * __thiscall
Imath_3_2::Matrix33<double>::operator+=(Matrix33<double> *this,Matrix33<double> *v)

{
  this->x[0][0] = v->x[0][0] + this->x[0][0];
  this->x[0][1] = v->x[0][1] + this->x[0][1];
  this->x[0][2] = v->x[0][2] + this->x[0][2];
  this->x[1][0] = v->x[1][0] + this->x[1][0];
  this->x[1][1] = v->x[1][1] + this->x[1][1];
  this->x[1][2] = v->x[1][2] + this->x[1][2];
  this->x[2][0] = v->x[2][0] + this->x[2][0];
  this->x[2][1] = v->x[2][1] + this->x[2][1];
  this->x[2][2] = v->x[2][2] + this->x[2][2];
  return this;
}

Assistant:

const Matrix33<T>&
Matrix33<T>::operator+= (const Matrix33<T>& v) IMATH_NOEXCEPT
{
    x[0][0] += v.x[0][0];
    x[0][1] += v.x[0][1];
    x[0][2] += v.x[0][2];
    x[1][0] += v.x[1][0];
    x[1][1] += v.x[1][1];
    x[1][2] += v.x[1][2];
    x[2][0] += v.x[2][0];
    x[2][1] += v.x[2][1];
    x[2][2] += v.x[2][2];

    return *this;
}